

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

InterpretResult __thiscall VM::run(VM *this)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>_>
  *this_00;
  char *pcVar1;
  uchar uVar2;
  uint uVar3;
  Instructions *pIVar4;
  pointer puVar5;
  size_t sVar6;
  Tape *this_01;
  mapped_type *pmVar7;
  mapped_type *pmVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  string error;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = &this->tapes;
LAB_0010560b:
  do {
    pIVar4 = this->instructions;
    uVar3 = this->ip;
    puVar5 = (pIVar4->code).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(pIVar4->code).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar5) <= (ulong)(long)(int)uVar3)
    {
      return OK;
    }
    uVar9 = uVar3 + 1;
    this->ip = uVar9;
  } while (10 < puVar5[(int)uVar3]);
  switch(puVar5[(int)uVar3]) {
  case '\0':
    this->ip = uVar3 + 2;
    Instructions::getNameAt_abi_cxx11_(&local_70,pIVar4,(uint)puVar5[(int)uVar9]);
    pmVar7 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)this_00,&local_70);
    pmVar7->ptr = pmVar7->ptr + 1;
    break;
  case '\x01':
    this->ip = uVar3 + 2;
    Instructions::getNameAt_abi_cxx11_(&local_70,pIVar4,(uint)puVar5[(int)uVar9]);
    pmVar7 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)this_00,&local_70);
    sVar6 = pmVar7->ptr;
    if (sVar6 == 0) {
      std::operator+(&local_50,"Attempting to decrement the pointer below 0 on ",&local_70);
      std::operator+(&error,&local_50,".");
      std::__cxx11::string::~string((string *)&local_50);
      runtimeError(this,error._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&error);
    }
    else {
      pmVar7->ptr = sVar6 - 1;
    }
    std::__cxx11::string::~string((string *)&local_70);
    if (sVar6 == 0) {
      return RUNTIME_ERROR;
    }
    goto LAB_0010560b;
  case '\x02':
    this->ip = uVar3 + 2;
    Instructions::getNameAt_abi_cxx11_(&local_70,pIVar4,(uint)puVar5[(int)uVar9]);
    pmVar7 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)this_00,&local_70);
    pcVar1 = (pmVar7->values).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start + pmVar7->ptr;
    *pcVar1 = *pcVar1 + '\x01';
    break;
  case '\x03':
    this->ip = uVar3 + 2;
    Instructions::getNameAt_abi_cxx11_(&local_70,pIVar4,(uint)puVar5[(int)uVar9]);
    pmVar7 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)this_00,&local_70);
    pcVar1 = (pmVar7->values).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start + pmVar7->ptr;
    *pcVar1 = *pcVar1 + -1;
    break;
  case '\x04':
    this->ip = uVar3 + 2;
    Instructions::getNameAt_abi_cxx11_(&local_70,pIVar4,(uint)puVar5[(int)uVar9]);
    pmVar7 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)this_00,&local_70);
    std::operator<<((ostream *)&std::cout,
                    (pmVar7->values).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start[pmVar7->ptr]);
    break;
  case '\x05':
    this->ip = uVar3 + 2;
    Instructions::getNameAt_abi_cxx11_(&local_70,pIVar4,(uint)puVar5[(int)uVar9]);
    pmVar7 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)this_00,&local_70);
    iVar10 = getchar();
    (pmVar7->values).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
    ._M_start[pmVar7->ptr] = (char)iVar10;
    std::__cxx11::string::~string((string *)&local_70);
    goto LAB_0010560b;
  case '\x06':
    this->ip = uVar3 + 2;
    Instructions::getNameAt_abi_cxx11_(&local_70,pIVar4,(uint)puVar5[(int)uVar9]);
    pmVar7 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)this_00,&local_70);
    uVar3 = this->ip;
    this->ip = uVar3 + 1;
    puVar5 = (this->instructions->code).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = puVar5[(int)uVar3];
    this->ip = uVar3 + 2;
    if ((pmVar7->values).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start[pmVar7->ptr] == '\0') {
      this->ip = (uint)CONCAT11(uVar2,puVar5[(int)(uVar3 + 1)]) + uVar3 + 2;
    }
    break;
  case '\a':
    this->ip = uVar3 + 3;
    uVar2 = puVar5[(int)(uVar3 + 2)];
    this->ip = uVar3 + 4;
    this->ip = (uVar3 - CONCAT11(uVar2,puVar5[(int)(uVar3 + 3)])) + 4;
    goto LAB_0010560b;
  case '\b':
    this->ip = uVar3 + 2;
    Instructions::getNameAt_abi_cxx11_(&local_70,pIVar4,(uint)puVar5[(int)uVar9]);
    Tape::Tape((Tape *)&error);
    this_01 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_00,&local_70);
    goto LAB_001058a4;
  case '\t':
    this->ip = uVar3 + 2;
    Instructions::getNameAt_abi_cxx11_(&local_70,pIVar4,(uint)puVar5[(int)uVar9]);
    Tape::Tape((Tape *)&error);
    this_01 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_00,&local_70);
LAB_001058a4:
    Tape::operator=(this_01,(Tape *)&error);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)&error);
    break;
  case '\n':
    goto switchD_00105640_caseD_a;
  }
  std::__cxx11::string::~string((string *)&local_70);
  goto LAB_0010560b;
switchD_00105640_caseD_a:
  this->ip = uVar3 + 2;
  Instructions::getNameAt_abi_cxx11_(&local_70,pIVar4,(uint)puVar5[(int)uVar9]);
  pmVar7 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)this_00,&local_70);
  iVar10 = (int)(pmVar7->values).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start[pmVar7->ptr];
  pIVar4 = this->instructions;
  iVar11 = (int)((ulong)((long)(pIVar4->names).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pIVar4->names).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 5);
  if (iVar10 < iVar11) {
    Instructions::getNameAt_abi_cxx11_(&error,pIVar4,iVar10);
    pmVar8 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)this_00,&error);
    std::__cxx11::string::~string((string *)&error);
    (pmVar7->values).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
    ._M_start[pmVar7->ptr] =
         (pmVar8->values).super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start[pmVar8->ptr];
  }
  else {
    runtimeError(this,"Attempting to copy a value from a tape that does not exist.");
  }
  std::__cxx11::string::~string((string *)&local_70);
  if (iVar11 <= iVar10) {
    return RUNTIME_ERROR;
  }
  goto LAB_0010560b;
}

Assistant:

InterpretResult VM::run()
{
    auto readByte = [this]() -> uint8_t
    {
        return this->instructions.getCodeAt(this->ip++);
    };

    while (instructions.hasCodeAt(ip))
    {
#ifdef DEBUG_TRACE_EXECUTION
        instructions.disassembleInstruction(ip);
#endif

        auto instruction = OpCode(readByte());
        switch (instruction)
        {
            case OpCode::BEGIN:
            {
                const auto& name = instructions.getNameAt(readByte());
                auto& tape = tapes.at(name);
                
                uint16_t offset = (readByte() << 8) | readByte();
                if (tape.values[tape.ptr] == 0) ip += offset;

                break;
            }
            case OpCode::DECATPTR:
            {
                const auto& name = instructions.getNameAt(readByte());
                auto& tape = tapes.at(name);
                tape.values[tape.ptr] = tape.values[tape.ptr] - 1;

                break;
            }
            case OpCode::DECPTR:
            {
                const auto& name = instructions.getNameAt(readByte());
                auto& tape = tapes.at(name);
                if (tape.ptr == 0)
                {
                    std::string error = "Attempting to decrement the pointer below 0 on " + name + ".";
                    runtimeError(error.c_str());
                    return InterpretResult::RUNTIME_ERROR;
                }
                else
                {
                    tape.ptr--;
                }
                break;
            }
            case OpCode::DEFINE_NAME:
            {
                const auto& name = instructions.getNameAt(readByte());
                tapes[name] = Tape();
                break;
            }
            case OpCode::DELETE_NAME:
            {
                // Should actually erase the tape or something here.
                const auto& name = instructions.getNameAt(readByte());
                tapes[name] = Tape();
                break;
            }
            case OpCode::END:
            {
                readByte(); // Tape name, not required here.
                uint16_t offset = (readByte() << 8) | readByte();
                ip -= offset;
                break;
            }
            case OpCode::INCATPTR:
            {
                const auto& name = instructions.getNameAt(readByte());
                auto& tape = tapes.at(name);
                tape.values[tape.ptr] = tape.values[tape.ptr] + 1;

                break;
            }
            case OpCode::INCPTR:
            {
                const auto& name = instructions.getNameAt(readByte());
                auto& tape = tapes.at(name);
                tape.ptr++;
                break;
            }
            case OpCode::INPUT:
            {
                const auto& name = instructions.getNameAt(readByte());
                auto& tape = tapes.at(name);
                tape.values[tape.ptr] = getchar();
                break;
            }
            case OpCode::OUTPUT:
            {
                const auto& name = instructions.getNameAt(readByte());
                auto& tape = tapes.at(name);
                std::cout << tape.values[tape.ptr];
                break;
            }
            case OpCode::COPY_FROM:
            {
                const auto& name = instructions.getNameAt(readByte());
                auto& tape = tapes.at(name);
                auto fromIdx = tape.values[tape.ptr];
                if (fromIdx >= instructions.tapeCount())
                {
                    runtimeError("Attempting to copy a value from a tape that does not exist.");
                    return InterpretResult::RUNTIME_ERROR;
                }
                else
                {
                    auto& fromTape = tapes.at(instructions.getNameAt(fromIdx));
                    tape.values[tape.ptr] = fromTape.values[fromTape.ptr];
                }
                break;
            }
        }
    }
    return InterpretResult::OK;
}